

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_reservestack(HSQUIRRELVM v,SQInteger nsize)

{
  long lVar1;
  size_type sVar2;
  size_type sVar3;
  int iVar4;
  SQRESULT SVar5;
  long in_RSI;
  long in_RDI;
  sqvector<SQObjectPtr,_unsigned_int> *this;
  SQChar *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  size_type newsize;
  undefined4 in_stack_ffffffffffffffb0;
  int local_18;
  
  lVar1 = *(long *)(in_RDI + 0x48);
  sVar2 = sqvector<SQObjectPtr,_unsigned_int>::size
                    ((sqvector<SQObjectPtr,_unsigned_int> *)(in_RDI + 0x30));
  local_18 = (int)in_RSI;
  if ((ulong)sVar2 < (ulong)(lVar1 + in_RSI)) {
    if (*(long *)(in_RDI + 0x138) != 0) {
      SVar5 = sq_throwerror((HSQUIRRELVM)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff98);
      return SVar5;
    }
    this = (sqvector<SQObjectPtr,_unsigned_int> *)(in_RDI + 0x30);
    sVar2 = sqvector<SQObjectPtr,_unsigned_int>::size(this);
    newsize = (size_type)((ulong)this >> 0x20);
    local_18 = *(int *)(in_RDI + 0x48) + local_18;
    sVar3 = sqvector<SQObjectPtr,_unsigned_int>::size
                      ((sqvector<SQObjectPtr,_unsigned_int> *)(in_RDI + 0x30));
    iVar4 = sVar2 + (local_18 - sVar3);
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)CONCAT44(sVar2,local_18));
    sqvector<SQObjectPtr,_unsigned_int>::resize
              ((sqvector<SQObjectPtr,_unsigned_int> *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
               newsize,(SQObjectPtr *)CONCAT44(sVar2,local_18));
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)CONCAT44(sVar2,local_18));
  }
  return 0;
}

Assistant:

SQRESULT sq_reservestack(HSQUIRRELVM v,SQInteger nsize)
{
    if (((SQUnsignedInteger)v->_top + nsize) > v->_stack.size()) {
        if(v->_nmetamethodscall) {
            return sq_throwerror(v,_SC("cannot resize stack while in a metamethod"));
        }
        v->_stack.resize(v->_stack.size() + ((v->_top + nsize) - v->_stack.size()));
    }
    return SQ_OK;
}